

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildUnionEnumSwitchCase
          (SwiftGenerator *this,EnumDef *ed,string *field,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *buffer_constructor,string *indentation,bool is_vector)

{
  CodeWriter *this_00;
  SwiftGenerator *this_01;
  char *pcVar1;
  pointer ppEVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> constructor;
  string variant;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type;
  string ns_type;
  EnumVal ev;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  SwiftGenerator *local_268;
  char *local_260;
  EnumDef *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  char *local_210;
  char *local_208;
  IdlNamer *local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  EnumVal local_198;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_200 = &this->namer_;
  local_258 = ed;
  IdlNamer::NamespacedType_abi_cxx11_(&local_1b8,local_200,&ed->super_Definition);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"VALUETYPE",(allocator<char> *)&local_250);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&local_198.name,&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"{{ACCESS_TYPE}} var {{FIELDVAR}}: \\",
             (allocator<char> *)&local_198);
  CodeWriter::operator+=(this_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  pcVar1 = "{{VALUETYPE}}Union?";
  if (is_vector) {
    pcVar1 = "[{{VALUETYPE}}Union?]";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,pcVar1,(allocator<char> *)&local_198);
  CodeWriter::operator+=(this_00,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  local_260 = "(at: index";
  if (!is_vector) {
    local_260 = "";
  }
  std::operator+(&local_2a8,indentation,"switch _t.");
  std::operator+(&local_288,&local_2a8,field);
  std::operator+(&local_2c8,&local_288,"Type");
  std::operator+(&local_230,&local_2c8,local_260);
  pcVar1 = ")";
  if (!is_vector) {
    pcVar1 = "";
  }
  std::operator+(&local_250,&local_230,pcVar1);
  std::operator+(&local_198.name,&local_250," {");
  local_268 = this;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)buffer_constructor
             ,&local_198.name);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  ppEVar2 = (local_258->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_208 = "(";
  if (is_vector) {
    local_208 = "";
  }
  local_210 = ", ";
  if (!is_vector) {
    local_210 = "";
  }
  for (; ppEVar2 < (local_258->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish; ppEVar2 = ppEVar2 + 1) {
    EnumVal::EnumVal(&local_198,*ppEVar2);
    IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_250,local_200,&local_198);
    this_01 = local_268;
    if (local_198.union_type.base_type != BASE_TYPE_NONE) {
      if ((local_198.union_type.base_type == BASE_TYPE_STRUCT) &&
         ((local_198.union_type.struct_def)->fixed == true)) {
        GenType_abi_cxx11_(&local_2c8,local_268,&local_198.union_type,false);
        Mutable_abi_cxx11_(&local_288,this_01);
        std::operator+(&local_230,&local_2c8,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_2c8);
      }
      else {
        GenType_abi_cxx11_(&local_230,local_268,&local_198.union_type,false);
      }
      std::operator+(&local_2a8,indentation,"case .");
      std::operator+(&local_288,&local_2a8,&local_250);
      std::operator+(&local_2c8,&local_288,":");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 buffer_constructor,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::operator+(&local_70,indentation,"  var _v = _t.");
      std::operator+(&local_50,&local_70,field);
      std::operator+(&local_90,&local_50,local_208);
      std::operator+(&local_1f8,&local_90,local_260);
      std::operator+(&local_1d8,&local_1f8,local_210);
      std::operator+(&local_2a8,&local_1d8,"type: ");
      std::operator+(&local_288,&local_2a8,&local_230);
      std::operator+(&local_2c8,&local_288,".self)");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 buffer_constructor,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::operator+(&local_2a8,&local_1b8,"Union(_v?.unpack(), type: .");
      std::operator+(&local_288,&local_2a8,&local_250);
      std::operator+(&local_2c8,&local_288,")");
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::operator+(&local_1d8,indentation,"  ");
      std::operator+(&local_2a8,&local_1d8,field);
      if (is_vector) {
        std::operator+(&local_b0,".append(",&local_2c8);
        std::operator+(&local_1f8,&local_b0,")");
      }
      else {
        std::operator+(&local_1f8," = ",&local_2c8);
      }
      std::operator+(&local_288,&local_2a8,&local_1f8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 buffer_constructor,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_1f8);
      if (is_vector) {
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_230);
    }
    std::__cxx11::string::~string((string *)&local_250);
    EnumVal::~EnumVal(&local_198);
  }
  std::operator+(&local_198.name,indentation,"default: break");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)buffer_constructor
             ,&local_198.name);
  std::__cxx11::string::~string((string *)&local_198);
  std::operator+(&local_198.name,indentation,"}");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)buffer_constructor
             ,&local_198.name);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  return;
}

Assistant:

void BuildUnionEnumSwitchCase(const EnumDef &ed, const std::string &field,
                                std::vector<std::string> &buffer_constructor,
                                const std::string &indentation = "",
                                const bool is_vector = false) {
    const auto ns_type = namer_.NamespacedType(ed);
    code_.SetValue("VALUETYPE", ns_type);
    code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: \\";
    code_ += is_vector ? "[{{VALUETYPE}}Union?]" : "{{VALUETYPE}}Union?";

    const auto vector_reader = is_vector ? "(at: index" : "";
    buffer_constructor.push_back(indentation + "switch _t." + field + "Type" +
                                 vector_reader + (is_vector ? ")" : "") + " {");

    for (auto it = ed.Vals().begin(); it < ed.Vals().end(); ++it) {
      const auto ev = **it;
      const auto variant = namer_.LegacySwiftVariant(ev);
      if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }
      const auto type = IsStruct(ev.union_type)
                            ? GenType(ev.union_type) + Mutable()
                            : GenType(ev.union_type);
      buffer_constructor.push_back(indentation + "case ." + variant + ":");
      buffer_constructor.push_back(
          indentation + "  var _v = _t." + field + (is_vector ? "" : "(") +
          vector_reader + (is_vector ? ", " : "") + "type: " + type + ".self)");
      const auto constructor =
          ns_type + "Union(_v?.unpack(), type: ." + variant + ")";
      buffer_constructor.push_back(
          indentation + "  " + field +
          (is_vector ? ".append(" + constructor + ")" : " = " + constructor));
    }
    buffer_constructor.push_back(indentation + "default: break");
    buffer_constructor.push_back(indentation + "}");
  }